

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

LY_ERR lyd_validate_unres(lyd_node **tree,lys_module *mod,lyd_type data_type,ly_set *node_when,
                         uint32_t when_xp_opts,ly_set *node_types,ly_set *meta_types,
                         ly_set *ext_node,ly_set *ext_val,uint32_t val_opts,lyd_node **diff)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ly_ctx *local_90;
  ly_ctx *local_88;
  lysc_type *local_80;
  lysc_type *type_1;
  lyd_meta *meta;
  lysc_type *type;
  lyd_node_term *node;
  lyd_node *plStack_58;
  uint32_t prev_count;
  lyd_ctx_ext_node *ext_n;
  lyd_ctx_ext_val *ext_v;
  LY_ERR local_40;
  uint32_t i;
  LY_ERR rc;
  LY_ERR r;
  ly_set *node_types_local;
  ly_set *plStack_28;
  uint32_t when_xp_opts_local;
  ly_set *node_when_local;
  lys_module *plStack_18;
  lyd_type data_type_local;
  lys_module *mod_local;
  lyd_node **tree_local;
  
  local_40 = LY_SUCCESS;
  _rc = node_types;
  node_types_local._4_4_ = when_xp_opts;
  plStack_28 = node_when;
  node_when_local._4_4_ = data_type;
  plStack_18 = mod;
  mod_local = (lys_module *)tree;
  if ((ext_val != (ly_set *)0x0) && (ext_val->count != 0)) {
    ext_v._4_4_ = ext_val->count;
    do {
      ext_v._4_4_ = ext_v._4_4_ - 1;
      ext_n = (lyd_ctx_ext_node *)(ext_val->field_2).dnodes[ext_v._4_4_];
      uVar1._0_4_ = ((lyd_node *)ext_n)->hash;
      uVar1._4_4_ = ((lyd_node *)ext_n)->flags;
      i = (**(code **)(*(long *)(**(long **)ext_n + 0x18) + 0x40))
                    (uVar1,((lyd_node *)ext_n)->schema,mod_local->ctx,node_when_local._4_4_,val_opts
                     ,diff);
      if (i != LY_SUCCESS) {
        if (i != LY_EVALID) {
          return i;
        }
        local_40 = LY_EVALID;
        if ((val_opts & 4) == 0) {
          return LY_EVALID;
        }
      }
      ly_set_rm_index(ext_val,ext_v._4_4_,free);
    } while (ext_v._4_4_ != 0);
  }
  if ((ext_node != (ly_set *)0x0) && (ext_node->count != 0)) {
    ext_v._4_4_ = ext_node->count;
    do {
      ext_v._4_4_ = ext_v._4_4_ - 1;
      plStack_58 = (ext_node->field_2).dnodes[ext_v._4_4_];
      uVar2._0_4_ = plStack_58->hash;
      uVar2._4_4_ = plStack_58->flags;
      i = (**(code **)(*(long *)(**(long **)plStack_58 + 0x18) + 0x30))
                    (uVar2,plStack_58->schema,val_opts);
      if (i != LY_SUCCESS) {
        if (i != LY_EVALID) {
          return i;
        }
        local_40 = LY_EVALID;
        if ((val_opts & 4) == 0) {
          return LY_EVALID;
        }
      }
      ly_set_rm_index(ext_node,ext_v._4_4_,free);
    } while (ext_v._4_4_ != 0);
  }
  if (plStack_28 != (ly_set *)0x0) {
    do {
      node._4_4_ = plStack_28->count;
      i = lyd_validate_unres_when
                    ((lyd_node **)mod_local,plStack_18,plStack_28,val_opts,node_types_local._4_4_,
                     _rc,diff);
      if (i != LY_SUCCESS) {
        if (i != LY_EVALID) {
          return i;
        }
        local_40 = LY_EVALID;
        if ((val_opts & 4) == 0) {
          return LY_EVALID;
        }
      }
    } while (plStack_28->count < node._4_4_);
    if ((plStack_28->count != 0) && ((local_40 != LY_EVALID || ((val_opts & 4) == 0)))) {
      __assert_fail("!node_when->count || ((rc == LY_EVALID) && (val_opts & LYD_VALIDATE_MULTI_ERROR))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                    ,0x1ee,
                    "LY_ERR lyd_validate_unres(struct lyd_node **, const struct lys_module *, enum lyd_type, struct ly_set *, uint32_t, struct ly_set *, struct ly_set *, struct ly_set *, struct ly_set *, uint32_t, struct lyd_node **)"
                   );
    }
  }
  if ((_rc != (ly_set *)0x0) && (_rc->count != 0)) {
    ext_v._4_4_ = _rc->count;
    do {
      ext_v._4_4_ = ext_v._4_4_ - 1;
      type = (lysc_type *)(_rc->field_2).dnodes[ext_v._4_4_];
      meta = (lyd_meta *)((lyd_node *)type)->schema[1].parent;
      ly_log_location((lysc_node *)0x0,(lyd_node *)type,(char *)0x0,(ly_in *)0x0);
      if (type->exts == (lysc_ext_instance *)0x0) {
        local_88 = *(ly_ctx **)&type[3].basetype;
      }
      else {
        local_88 = *(ly_ctx **)type->exts->argument;
      }
      i = lyd_value_validate_incomplete
                    (local_88,(lysc_type *)meta,(lyd_value *)&type[1].basetype,(lyd_node *)type,
                     (lyd_node *)mod_local->ctx);
      ly_log_location_revert(0,1,0,0);
      if (i != 0) {
        local_40 = i;
        if (i != 7) {
          return i;
        }
        if ((val_opts & 4) == 0) {
          return LY_EVALID;
        }
      }
      ly_set_rm_index(_rc,ext_v._4_4_,(_func_void_void_ptr *)0x0);
    } while (ext_v._4_4_ != 0);
  }
  if ((meta_types != (ly_set *)0x0) && (meta_types->count != 0)) {
    ext_v._4_4_ = meta_types->count;
    do {
      ext_v._4_4_ = ext_v._4_4_ - 1;
      type_1 = (lysc_type *)(meta_types->field_2).dnodes[ext_v._4_4_];
      lyplg_ext_get_storage((lysc_ext_instance *)((lyd_node *)type_1)->parent,0x2e0000,8,&local_80);
      if (*(long *)(type_1->name + 8) == 0) {
        local_90 = *(ly_ctx **)(type_1->name + 0x78);
      }
      else {
        local_90 = (ly_ctx *)**(undefined8 **)(*(long *)(type_1->name + 8) + 8);
      }
      i = lyd_value_validate_incomplete
                    (local_90,local_80,(lyd_value *)(type_1 + 1),(lyd_node *)type_1->name,
                     (lyd_node *)mod_local->ctx);
    } while (((i == LY_SUCCESS) || ((local_40 = i, i == LY_EVALID && ((val_opts & 4) != 0)))) &&
            (ly_set_rm_index(meta_types,ext_v._4_4_,(_func_void_void_ptr *)0x0), ext_v._4_4_ != 0));
  }
  return local_40;
}

Assistant:

LY_ERR
lyd_validate_unres(struct lyd_node **tree, const struct lys_module *mod, enum lyd_type data_type, struct ly_set *node_when,
        uint32_t when_xp_opts, struct ly_set *node_types, struct ly_set *meta_types, struct ly_set *ext_node,
        struct ly_set *ext_val, uint32_t val_opts, struct lyd_node **diff)
{
    LY_ERR r, rc = LY_SUCCESS;
    uint32_t i;

    if (ext_val && ext_val->count) {
        /* first validate parsed extension data */
        i = ext_val->count;
        do {
            --i;

            struct lyd_ctx_ext_val *ext_v = ext_val->objs[i];

            /* validate extension data */
            r = ext_v->ext->def->plugin->validate(ext_v->ext, ext_v->sibling, *tree, data_type, val_opts, diff);
            LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);

            /* remove this item from the set */
            ly_set_rm_index(ext_val, i, free);
        } while (i);
    }

    if (ext_node && ext_node->count) {
        /* validate data nodes with extension instances */
        i = ext_node->count;
        do {
            --i;

            struct lyd_ctx_ext_node *ext_n = ext_node->objs[i];

            /* validate the node */
            r = ext_n->ext->def->plugin->node(ext_n->ext, ext_n->node, val_opts);
            LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);

            /* remove this item from the set */
            ly_set_rm_index(ext_node, i, free);
        } while (i);
    }

    if (node_when) {
        /* evaluate all when conditions */
        uint32_t prev_count;

        do {
            prev_count = node_when->count;
            r = lyd_validate_unres_when(tree, mod, node_when, val_opts, when_xp_opts, node_types, diff);
            LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);

            /* there must have been some when conditions resolved */
        } while (prev_count > node_when->count);

        /* there could have been no cyclic when dependencies, checked during compilation */
        assert(!node_when->count || ((rc == LY_EVALID) && (val_opts & LYD_VALIDATE_MULTI_ERROR)));
    }

    if (node_types && node_types->count) {
        /* finish incompletely validated terminal values (traverse from the end for efficient set removal) */
        i = node_types->count;
        do {
            --i;

            struct lyd_node_term *node = node_types->objs[i];
            struct lysc_type *type = ((struct lysc_node_leaf *)node->schema)->type;

            /* resolve the value of the node */
            LOG_LOCSET(NULL, &node->node);
            r = lyd_value_validate_incomplete(LYD_CTX(node), type, &node->value, &node->node, *tree);
            LOG_LOCBACK(0, 1);
            LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);

            /* remove this node from the set */
            ly_set_rm_index(node_types, i, NULL);
        } while (i);
    }

    if (meta_types && meta_types->count) {
        /* ... and metadata values */
        i = meta_types->count;
        do {
            --i;

            struct lyd_meta *meta = meta_types->objs[i];
            struct lysc_type *type;

            /* validate and store the value of the metadata */
            lyplg_ext_get_storage(meta->annotation, LY_STMT_TYPE, sizeof type, (const void **)&type);
            r = lyd_value_validate_incomplete(LYD_CTX(meta->parent), type, &meta->value, meta->parent, *tree);
            LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);

            /* remove this attr from the set */
            ly_set_rm_index(meta_types, i, NULL);
        } while (i);
    }

cleanup:
    return rc;
}